

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

int ImTextCharFromUtf8(uint *out_char,char *in_text,char *in_text_end)

{
  uint uVar1;
  uchar *str;
  uint c;
  char *in_text_end_local;
  char *in_text_local;
  uint *out_char_local;
  
  if ((*in_text & 0x80U) == 0) {
    *out_char = (uint)(byte)*in_text;
    out_char_local._4_4_ = 1;
  }
  else if ((*in_text & 0xe0U) == 0xc0) {
    *out_char = 0xfffd;
    if ((in_text_end == (char *)0x0) || (1 < (long)in_text_end - (long)in_text)) {
      if ((byte)*in_text < 0xc2) {
        out_char_local._4_4_ = 2;
      }
      else if ((in_text[1] & 0xc0U) == 0x80) {
        *out_char = ((byte)in_text[1] & 0x3f) + ((byte)*in_text & 0x1f) * 0x40;
        out_char_local._4_4_ = 2;
      }
      else {
        out_char_local._4_4_ = 2;
      }
    }
    else {
      out_char_local._4_4_ = 1;
    }
  }
  else if ((*in_text & 0xf0U) == 0xe0) {
    *out_char = 0xfffd;
    if ((in_text_end == (char *)0x0) || (2 < (long)in_text_end - (long)in_text)) {
      if ((*in_text == -0x20) && (((byte)in_text[1] < 0xa0 || (0xbf < (byte)in_text[1])))) {
        out_char_local._4_4_ = 3;
      }
      else if ((*in_text == -0x13) && (0x9f < (byte)in_text[1])) {
        out_char_local._4_4_ = 3;
      }
      else if ((in_text[1] & 0xc0U) == 0x80) {
        if ((in_text[2] & 0xc0U) == 0x80) {
          *out_char = ((byte)in_text[2] & 0x3f) +
                      ((byte)in_text[1] & 0x3f) * 0x40 + ((byte)*in_text & 0xf) * 0x1000;
          out_char_local._4_4_ = 3;
        }
        else {
          out_char_local._4_4_ = 3;
        }
      }
      else {
        out_char_local._4_4_ = 3;
      }
    }
    else {
      out_char_local._4_4_ = 1;
    }
  }
  else if ((*in_text & 0xf8U) == 0xf0) {
    *out_char = 0xfffd;
    if ((in_text_end == (char *)0x0) || (3 < (long)in_text_end - (long)in_text)) {
      if ((byte)*in_text < 0xf5) {
        if ((*in_text == -0x10) && (((byte)in_text[1] < 0x90 || (0xbf < (byte)in_text[1])))) {
          out_char_local._4_4_ = 4;
        }
        else if ((*in_text == -0xc) && (0x8f < (byte)in_text[1])) {
          out_char_local._4_4_ = 4;
        }
        else if ((in_text[1] & 0xc0U) == 0x80) {
          if ((in_text[2] & 0xc0U) == 0x80) {
            if ((in_text[3] & 0xc0U) == 0x80) {
              uVar1 = ((byte)in_text[3] & 0x3f) +
                      ((byte)in_text[2] & 0x3f) * 0x40 +
                      ((byte)in_text[1] & 0x3f) * 0x1000 + ((byte)*in_text & 7) * 0x40000;
              if ((uVar1 & 0xfffff800) == 0xd800) {
                out_char_local._4_4_ = 4;
              }
              else {
                *out_char = uVar1;
                out_char_local._4_4_ = 4;
              }
            }
            else {
              out_char_local._4_4_ = 4;
            }
          }
          else {
            out_char_local._4_4_ = 4;
          }
        }
        else {
          out_char_local._4_4_ = 4;
        }
      }
      else {
        out_char_local._4_4_ = 4;
      }
    }
    else {
      out_char_local._4_4_ = 1;
    }
  }
  else {
    *out_char = 0;
    out_char_local._4_4_ = 0;
  }
  return out_char_local._4_4_;
}

Assistant:

int ImTextCharFromUtf8(unsigned int* out_char, const char* in_text, const char* in_text_end)
{
    unsigned int c = (unsigned int)-1;
    const unsigned char* str = (const unsigned char*)in_text;
    if (!(*str & 0x80))
    {
        c = (unsigned int)(*str++);
        *out_char = c;
        return 1;
    }
    if ((*str & 0xe0) == 0xc0)
    {
        *out_char = 0xFFFD; // will be invalid but not end of string
        if (in_text_end && in_text_end - (const char*)str < 2) return 1;
        if (*str < 0xc2) return 2;
        c = (unsigned int)((*str++ & 0x1f) << 6);
        if ((*str & 0xc0) != 0x80) return 2;
        c += (*str++ & 0x3f);
        *out_char = c;
        return 2;
    }
    if ((*str & 0xf0) == 0xe0)
    {
        *out_char = 0xFFFD; // will be invalid but not end of string
        if (in_text_end && in_text_end - (const char*)str < 3) return 1;
        if (*str == 0xe0 && (str[1] < 0xa0 || str[1] > 0xbf)) return 3;
        if (*str == 0xed && str[1] > 0x9f) return 3; // str[1] < 0x80 is checked below
        c = (unsigned int)((*str++ & 0x0f) << 12);
        if ((*str & 0xc0) != 0x80) return 3;
        c += (unsigned int)((*str++ & 0x3f) << 6);
        if ((*str & 0xc0) != 0x80) return 3;
        c += (*str++ & 0x3f);
        *out_char = c;
        return 3;
    }
    if ((*str & 0xf8) == 0xf0)
    {
        *out_char = 0xFFFD; // will be invalid but not end of string
        if (in_text_end && in_text_end - (const char*)str < 4) return 1;
        if (*str > 0xf4) return 4;
        if (*str == 0xf0 && (str[1] < 0x90 || str[1] > 0xbf)) return 4;
        if (*str == 0xf4 && str[1] > 0x8f) return 4; // str[1] < 0x80 is checked below
        c = (unsigned int)((*str++ & 0x07) << 18);
        if ((*str & 0xc0) != 0x80) return 4;
        c += (unsigned int)((*str++ & 0x3f) << 12);
        if ((*str & 0xc0) != 0x80) return 4;
        c += (unsigned int)((*str++ & 0x3f) << 6);
        if ((*str & 0xc0) != 0x80) return 4;
        c += (*str++ & 0x3f);
        // utf-8 encodings of values used in surrogate pairs are invalid
        if ((c & 0xFFFFF800) == 0xD800) return 4;
        *out_char = c;
        return 4;
    }
    *out_char = 0;
    return 0;
}